

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte bVar1;
  symbol *psVar2;
  ushort *puVar3;
  void *__ptr;
  size_t __nmemb;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *__ptr_00;
  ulong uVar7;
  char *pcVar8;
  ushort **ppuVar9;
  ulong uVar10;
  byte *pbVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  ulong local_58;
  
  uVar6 = lemp->nsymbol;
  local_58 = (ulong)(int)uVar6;
  __nmemb = local_58 * 2;
  __ptr_00 = calloc(__nmemb,8);
  if (__ptr_00 != (void *)0x0) {
    uVar7 = 0;
    uVar14 = (uint)__nmemb;
    uVar10 = 0;
    if (0 < (int)uVar14) {
      uVar10 = __nmemb & 0xffffffff;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)__ptr_00 + uVar7 * 8) = 0;
    }
    uVar7 = 0;
    sVar17 = 0;
    if (lemp->vartype != (char *)0x0) {
      sVar17 = strlen(lemp->vartype);
    }
    uVar16 = 0;
    if (0 < (int)uVar6) {
      uVar16 = (ulong)uVar6;
    }
    for (; uVar6 = (uint)sVar17, uVar16 != uVar7; uVar7 = uVar7 + 1) {
      pcVar8 = lemp->symbols[uVar7]->datatype;
      if (pcVar8 != (char *)0x0) {
        sVar17 = strlen(pcVar8);
        uVar4 = (uint)sVar17;
        if ((int)(uint)sVar17 < (int)uVar6) {
          uVar4 = uVar6;
        }
        sVar17 = (size_t)uVar4;
      }
    }
    pcVar8 = (char *)malloc((long)(int)(uVar6 * 2 + 1));
    if (pcVar8 != (char *)0x0) {
      lVar18 = 0;
      do {
        if ((int)local_58 <= lVar18) {
          pcVar12 = "Parse";
          if (lemp->name != (char *)0x0) {
            pcVar12 = lemp->name;
          }
          local_58._0_4_ = *plineno;
          if (mhflag != 0) {
            fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
            local_58._0_4_ = (int)local_58 + 1;
          }
          pcVar13 = "void*";
          if (lemp->tokentype != (char *)0x0) {
            pcVar13 = lemp->tokentype;
          }
          fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar12,pcVar13);
          if (mhflag == 0) {
            local_58._0_4_ = (int)local_58 + 1;
          }
          else {
            fwrite("#endif\n",7,1,(FILE *)out);
            local_58._0_4_ = (int)local_58 + 2;
          }
          fwrite("typedef union {\n",0x10,1,(FILE *)out);
          fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
          fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar12);
          local_58._0_4_ = (int)local_58 + 3;
          uVar7 = 0;
          while (uVar10 != uVar7) {
            __ptr = *(void **)((long)__ptr_00 + uVar7 * 8);
            uVar7 = uVar7 + 1;
            if (__ptr != (void *)0x0) {
              fprintf((FILE *)out,"  %s yy%d;\n",__ptr,uVar7 & 0xffffffff);
              local_58._0_4_ = (int)local_58 + 1;
              free(__ptr);
            }
          }
          psVar2 = lemp->errsym;
          if ((psVar2 != (symbol *)0x0) && (psVar2->useCnt != 0)) {
            fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)psVar2->dtnum);
            local_58._0_4_ = (int)local_58 + 1;
          }
          free(pcVar8);
          free(__ptr_00);
          fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
          *plineno = (int)local_58 + 1;
          return;
        }
        psVar2 = lemp->symbols[lVar18];
        if (psVar2 == lemp->errsym) {
          psVar2->dtnum = uVar14 | 1;
        }
        else if ((psVar2->type == NONTERMINAL) &&
                ((pbVar15 = (byte *)psVar2->datatype, pbVar15 != (byte *)0x0 ||
                 (pbVar15 = (byte *)lemp->vartype, pbVar15 != (byte *)0x0)))) {
          ppuVar9 = __ctype_b_loc();
          puVar3 = *ppuVar9;
          pbVar11 = pbVar15 + -1;
          do {
            pbVar15 = pbVar15 + 1;
            uVar7 = (ulong)pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while ((*(byte *)((long)puVar3 + uVar7 * 2 + 1) & 0x20) != 0);
          uVar16 = 0;
          while ((char)uVar7 != '\0') {
            pcVar8[uVar16] = (char)uVar7;
            uVar16 = uVar16 + 1;
            bVar1 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            uVar7 = (ulong)bVar1;
          }
          for (; 0 < (int)uVar16; uVar16 = (ulong)((int)uVar16 - 1)) {
            if ((*(byte *)((long)puVar3 + (ulong)(byte)pcVar8[(uVar16 & 0xffffffff) - 1] * 2 + 1) &
                0x20) == 0) goto LAB_0010acfd;
          }
          uVar16 = 0;
LAB_0010acfd:
          pcVar8[uVar16 & 0xffffffff] = '\0';
          if ((lemp->tokentype == (char *)0x0) ||
             (iVar5 = strcmp(pcVar8,lemp->tokentype), iVar5 != 0)) {
            uVar6 = 0;
            for (pcVar12 = pcVar8; *pcVar12 != '\0'; pcVar12 = pcVar12 + 1) {
              uVar6 = uVar6 * 0x35 + (int)*pcVar12;
            }
            uVar7 = ((ulong)uVar6 & 0xffffffff7fffffff) % (__nmemb & 0xffffffff);
            while( true ) {
              pcVar12 = *(char **)((long)__ptr_00 + uVar7 * 8);
              if (pcVar12 == (char *)0x0) break;
              iVar5 = strcmp(pcVar12,pcVar8);
              uVar6 = (int)uVar7 + 1;
              if (iVar5 == 0) {
                psVar2->dtnum = uVar6;
                goto LAB_0010adb2;
              }
              if (uVar14 <= uVar6) {
                uVar6 = 0;
              }
              uVar7 = (ulong)uVar6;
            }
            psVar2->dtnum = (int)uVar7 + 1;
            sVar17 = strlen(pcVar8);
            pcVar12 = (char *)malloc((long)((int)sVar17 + 1));
            *(char **)((long)__ptr_00 + uVar7 * 8) = pcVar12;
            if (pcVar12 == (char *)0x0) break;
            lemon_strcpy(pcVar12,pcVar8);
            local_58 = (ulong)(uint)lemp->nsymbol;
          }
          else {
            psVar2->dtnum = 0;
          }
        }
        else {
          psVar2->dtnum = 0;
        }
LAB_0010adb2:
        lVar18 = lVar18 + 1;
      } while( true );
    }
  }
  fwrite("Out of memory.\n",0xf,1,_stderr);
  exit(1);
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}